

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O3

TString * loadStringN(LoadState *S,Proto *p)

{
  size_t l;
  lua_State *L;
  StkId pSVar1;
  size_t sVar2;
  TString *v;
  TString *x_;
  char buff [40];
  char acStack_58 [48];
  
  L = S->L;
  sVar2 = loadUnsigned(S,0xffffffffffffffff);
  if (sVar2 == 0) {
    v = (TString *)0x0;
  }
  else {
    l = sVar2 - 1;
    if (sVar2 < 0x2a) {
      loadBlock(S,acStack_58,l);
      v = luaS_newlstr(L,acStack_58,l);
    }
    else {
      v = luaS_createlngstrobj(L,l);
      pSVar1 = (L->top).p;
      *(TString **)pSVar1 = v;
      (pSVar1->val).tt_ = v->tt | 0x40;
      luaD_inctop(L);
      loadBlock(S,v->contents,l);
      (L->top).p = (StkId)((L->top).offset + -0x10);
    }
    if (((p->marked & 0x20) != 0) && ((v->marked & 0x18) != 0)) {
      luaC_barrier_(L,(GCObject *)p,(GCObject *)v);
    }
  }
  return v;
}

Assistant:

static TString *loadStringN (LoadState *S, Proto *p) {
  lua_State *L = S->L;
  TString *ts;
  size_t size = loadSize(S);
  if (size == 0)  /* no string? */
    return NULL;
  else if (--size <= LUAI_MAXSHORTLEN) {  /* short string? */
    char buff[LUAI_MAXSHORTLEN];
    loadVector(S, buff, size);  /* load string into buffer */
    ts = luaS_newlstr(L, buff, size);  /* create string */
  }
  else {  /* long string */
    ts = luaS_createlngstrobj(L, size);  /* create string */
    setsvalue2s(L, L->top.p, ts);  /* anchor it ('loadVector' can GC) */
    luaD_inctop(L);
    loadVector(S, getstr(ts), size);  /* load directly in final place */
    L->top.p--;  /* pop string */
  }
  luaC_objbarrier(L, p, ts);
  return ts;
}